

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

void sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding
               (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t binding)

{
  _Bool _Var1;
  sysbvm_tuple_t orderedCollection;
  
  _Var1 = sysbvm_tuple_isKindOf
                    (context,environment,(context->roots).analysisAndEvaluationEnvironmentType);
  if (!_Var1) {
    sysbvm_error("Expected an analysis and evaluation environment.");
  }
  orderedCollection = *(sysbvm_tuple_t *)(environment + 0x48);
  if (orderedCollection == 0) {
    orderedCollection = sysbvm_orderedCollection_create(context);
    *(sysbvm_tuple_t *)(environment + 0x48) = orderedCollection;
  }
  sysbvm_orderedCollection_add(context,orderedCollection,binding);
  return;
}

Assistant:

SYSBVM_API void sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t binding)
{
    if(!sysbvm_environment_isAnalysisAndEvaluationEnvironment(context, environment))
        sysbvm_error("Expected an analysis and evaluation environment.");

    sysbvm_analysisAndEvaluationEnvironment_t *environmentObject = (sysbvm_analysisAndEvaluationEnvironment_t*)environment;
    if(!environmentObject->usedTuplesWithNamedSlots)
        environmentObject->usedTuplesWithNamedSlots = sysbvm_orderedCollection_create(context);
    sysbvm_orderedCollection_add(context, environmentObject->usedTuplesWithNamedSlots, binding);
}